

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int CheckNonOpaque(uint8_t *alpha,int width,int height,int x_step,int y_step)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int local_18;
  uint8_t *local_10;
  
  if (in_RDI != (uint8_t *)0x0) {
    WebPInitAlphaProcessing();
    local_18 = in_EDX;
    local_10 = in_RDI;
    if (in_ECX == 1) {
      while (0 < local_18) {
        iVar1 = (*WebPHasAlpha8b)(local_10,in_ESI);
        if (iVar1 != 0) {
          return 1;
        }
        local_10 = local_10 + in_R8D;
        local_18 = local_18 + -1;
      }
    }
    else {
      while (0 < local_18) {
        iVar1 = (*WebPHasAlpha32b)(local_10,in_ESI);
        if (iVar1 != 0) {
          return 1;
        }
        local_10 = local_10 + in_R8D;
        local_18 = local_18 + -1;
      }
    }
  }
  return 0;
}

Assistant:

static int CheckNonOpaque(const uint8_t* alpha, int width, int height,
                          int x_step, int y_step) {
  if (alpha == NULL) return 0;
  WebPInitAlphaProcessing();
  if (x_step == 1) {
    for (; height-- > 0; alpha += y_step) {
      if (WebPHasAlpha8b(alpha, width)) return 1;
    }
  } else {
    for (; height-- > 0; alpha += y_step) {
      if (WebPHasAlpha32b(alpha, width)) return 1;
    }
  }
  return 0;
}